

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O3

int KINSetJacFn(void *kinmem,KINLsJacFn jac)

{
  int iVar1;
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KINMem local_20;
  KINLsMem local_18;
  
  iVar1 = kinLs_AccessLMem(kinmem,"KINSetJacFn",&local_20,&local_18);
  if (iVar1 == 0) {
    if (jac == (KINLsJacFn)0x0) {
      local_18->jacDQ = 1;
      local_18->jac = kinLsDQJac;
    }
    else {
      if (local_18->J == (SUNMatrix)0x0) {
        KINProcessError(local_20,-3,0xf6,"KINSetJacFn",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                        ,"Jacobian routine cannot be supplied for NULL SUNMatrix");
        return -3;
      }
      local_18->jacDQ = 0;
      local_18->jac = jac;
      local_20 = (KINMem)local_20->kin_user_data;
    }
    local_18->J_data = local_20;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINSetJacFn(void* kinmem, KINLsJacFn jac)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  int retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* return with failure if jac cannot be used */
  if ((jac != NULL) && (kinls_mem->J == NULL))
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Jacobian routine cannot be supplied for NULL SUNMatrix");
    return (KINLS_ILL_INPUT);
  }

  if (jac != NULL)
  {
    kinls_mem->jacDQ  = SUNFALSE;
    kinls_mem->jac    = jac;
    kinls_mem->J_data = kin_mem->kin_user_data;
  }
  else
  {
    kinls_mem->jacDQ  = SUNTRUE;
    kinls_mem->jac    = kinLsDQJac;
    kinls_mem->J_data = kin_mem;
  }

  return (KINLS_SUCCESS);
}